

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsBoolean.c
# Opt level: O2

void JsBooleanInit(JsVm *vm)

{
  JsObject *pJVar1;
  JsObject *pJVar2;
  JsValue *pJVar3;
  JsObject *pJVar4;
  
  pJVar1 = JsCreateStandardFunctionObject((JsObject *)0x0,(JsList)0x0,1);
  pJVar2 = JsCreateBooleanObject((JsObject *)0x0,0);
  pJVar1->Call = JsBooleanConstCall;
  pJVar1->Construct = JsBooleanConstConstruct;
  pJVar3 = (JsValue *)JsMalloc(0x18);
  pJVar3->type = JS_OBJECT;
  (pJVar3->u).object = pJVar2;
  (*pJVar1->Put)(pJVar1,"prototype",pJVar3,7);
  JsMalloc(0x18);
  pJVar3 = (JsValue *)JsMalloc(0x18);
  pJVar3->type = JS_OBJECT;
  (pJVar3->u).object = pJVar1;
  (*pJVar2->Put)(pJVar2,"constructor",pJVar3,2);
  pJVar3 = (JsValue *)JsMalloc(0x18);
  pJVar3->type = JS_OBJECT;
  pJVar4 = JsCreateStandardFunctionObject((JsObject *)0x0,(JsList)0x0,0);
  (pJVar3->u).object = pJVar4;
  pJVar4->Call = JsBooleanProtoToString;
  (*pJVar2->Put)(pJVar2,"toString",pJVar3,2);
  pJVar3 = (JsValue *)JsMalloc(0x18);
  pJVar3->type = JS_OBJECT;
  pJVar4 = JsCreateStandardFunctionObject((JsObject *)0x0,(JsList)0x0,0);
  (pJVar3->u).object = pJVar4;
  pJVar4->Call = JsBooleanProtoValueOf;
  (*pJVar2->Put)(pJVar2,"valueOf",pJVar3,2);
  pJVar3 = (JsValue *)JsMalloc(0x18);
  pJVar3->type = JS_OBJECT;
  (pJVar3->u).object = pJVar1;
  (*vm->Global->Put)(vm->Global,"Boolean",pJVar3,7);
  return;
}

Assistant:

void JsBooleanInit(struct JsVm* vm){
	
	struct JsObject* boolean = JsCreateStandardFunctionObject(NULL,NULL,TRUE);
	struct JsObject* boolean_proto = JsCreateBooleanObject(NULL,FALSE);
	
	JsBooleanFunctionInit(boolean,boolean_proto);
	JsBooleanProtoInit(boolean,boolean_proto);
	struct JsValue* v = (struct JsValue*)JsMalloc(sizeof(struct JsValue));
	v->type = JS_OBJECT;
	v->u.object = boolean;
	(*vm->Global->Put)(vm->Global,"Boolean",v,JS_OBJECT_ATTR_STRICT);
}